

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O1

void __thiscall RotSpaceConstructor::test_method(RotSpaceConstructor *this)

{
  undefined4 local_204;
  long local_200;
  undefined4 *local_1f8;
  long *local_1f0;
  undefined **local_1e8;
  char *local_1e0;
  undefined8 *local_1d8;
  char *local_1d0;
  undefined **local_1c8;
  ulong local_1c0;
  shared_count sStack_1b8;
  undefined4 **local_1b0;
  undefined1 local_1a8 [8];
  undefined8 local_1a0;
  shared_count sStack_198;
  undefined **local_190;
  undefined1 local_188;
  undefined8 *local_180;
  undefined ***local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  SO3<mnf::ExpMapQuaternion> S;
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&S);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x2d);
  local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
  local_1e8 = &PTR__lazy_ostream_00135a50;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = "";
  local_200 = mnf::Manifold::dim();
  local_1f0 = &local_200;
  local_1a8[0] = local_200 == 3;
  local_1f8 = &local_204;
  local_204 = 3;
  local_1a0 = 0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_168 = "";
  local_178 = (undefined ***)&local_1f0;
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_00135ac8;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1f8;
  local_1c0 = local_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00135b08;
  sStack_1b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_1a8,&local_1e8,&local_170,0x2d,1,2,2,"S.dim()",&local_190,"3",&local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2e);
  local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
  local_1e8 = &PTR__lazy_ostream_00135a50;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = "";
  local_200 = mnf::Manifold::representationDim();
  local_204 = 4;
  local_1a8[0] = local_200 == 4;
  local_1a0 = 0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_168 = "";
  local_1f0 = &local_200;
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_00135ac8;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_178 = (undefined ***)&local_1f0;
  local_1f8 = &local_204;
  local_1c0 = local_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00135b08;
  sStack_1b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (local_1a8,&local_1e8,&local_170,0x2e,1,2,2,"S.representationDim()",&local_190,"4",
             &local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x2f);
  local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
  local_1e8 = &PTR__lazy_ostream_00135a50;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = "";
  local_200 = 1;
  local_204 = 1;
  local_1a8[0] = 1;
  local_1a0 = 0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_168 = "";
  local_1f0 = &local_200;
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_00135b48;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_178 = (undefined ***)&local_1f0;
  local_1f8 = &local_204;
  local_1c0 = local_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00135b08;
  sStack_1b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (local_1a8,&local_1e8,&local_170,0x2f,1,2,2,"S.numberOfSubManifolds()",&local_190,"1",
             &local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x30);
  local_1c8 = (undefined **)CONCAT71(local_1c8._1_7_,1);
  local_1c0 = 0;
  sStack_1b8.pi_ = (sp_counted_base *)0x0;
  local_1e8 = (undefined **)0x1293a0;
  local_1e0 = "";
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_00135b88;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_158 = "";
  local_178 = &local_1e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1b8);
  S._0_8_ = &PTR__SO3_00135670;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap(&S.bufferMap_);
  mnf::Manifold::~Manifold(&S.super_Manifold);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RotSpaceConstructor)
{
  SO3<ExpMapQuaternion> S;
  BOOST_CHECK_EQUAL(S.dim(), 3);
  BOOST_CHECK_EQUAL(S.representationDim(), 4);
  BOOST_CHECK_EQUAL(S.numberOfSubManifolds(), 1);
  BOOST_CHECK(S.isElementary());
}